

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValue * __thiscall QCborContainerPrivate::valueAt(QCborContainerPrivate *this,qsizetype idx)

{
  bool bVar1;
  const_reference n;
  qsizetype qVar2;
  undefined8 in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  Element *e;
  ValueFlag other;
  QCborValue *this_00;
  ContainerDisposition disp;
  Type type;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_10;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_c;
  long local_8;
  
  type = (Type)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  n = QList<QtCbor::Element>::at((QList<QtCbor::Element> *)in_RDI,(qsizetype)in_RDI);
  other = (ValueFlag)((ulong)in_RDI >> 0x20);
  local_c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (QFlagsStorage<QtCbor::Element::ValueFlag>)
       QFlags<QtCbor::Element::ValueFlag>::operator&
                 ((QFlags<QtCbor::Element::ValueFlag> *)this_00,other);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c);
  if (bVar1) {
    if (n->type == Tag) {
      qVar2 = QList<QtCbor::Element>::size(&((n->field_0).container)->elements);
      if (qVar2 != 2) {
        makeValue(type,(qint64)n,in_RSI,(ContainerDisposition)((ulong)this_00 >> 0x20));
        goto LAB_001abe14;
      }
    }
    makeValue(type,(qint64)n,in_RSI,(ContainerDisposition)((ulong)this_00 >> 0x20));
  }
  else {
    local_10.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorage<QtCbor::Element::ValueFlag>)
         QFlags<QtCbor::Element::ValueFlag>::operator&
                   ((QFlags<QtCbor::Element::ValueFlag> *)this_00,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
    disp = (ContainerDisposition)((ulong)this_00 >> 0x20);
    if (bVar1) {
      makeValue(type,(qint64)n,in_RSI,disp);
    }
    else {
      makeValue(type,(qint64)n,in_RSI,disp);
    }
  }
LAB_001abe14:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue valueAt(qsizetype idx) const
    {
        const auto &e = elements.at(idx);

        if (e.flags & QtCbor::Element::IsContainer) {
            if (e.type == QCborValue::Tag && e.container->elements.size() != 2) {
                // invalid tags can be created due to incomplete parsing
                return makeValue(QCborValue::Invalid, 0, nullptr);
            }
            return makeValue(e.type, -1, e.container);
        } else if (e.flags & QtCbor::Element::HasByteData) {
            return makeValue(e.type, idx, const_cast<QCborContainerPrivate *>(this));
        }
        return makeValue(e.type, e.value);
    }